

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<7,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  int col_5;
  long lVar4;
  undefined4 *puVar5;
  long lVar6;
  long lVar7;
  Matrix<float,_2,_2> *pMVar8;
  Matrix<float,_2,_2> *a;
  bool bVar9;
  undefined4 uVar10;
  Matrix<float,_2,_2> blockD;
  Matrix<float,_2,_2> blockC;
  Vector<float,_3> res_1;
  float areaD [4];
  float areaC [4];
  float areaB [4];
  Matrix<float,_2,_2> blockB;
  Matrix<float,_2,_2> blockA;
  Matrix<float,_2,_2> invA;
  Type in0;
  Vector<float,_3> res_2;
  Matrix<float,_2,_2> zeroMat;
  float nullField [4];
  float areaA [4];
  Matrix<float,_2,_2> matC;
  Matrix<float,_2,_2> matB;
  Matrix<float,_2,_2> schurComplement;
  Matrix<float,_2,_2> matD;
  Matrix<float,_2,_2> local_1e8;
  Matrix<float,_2,_2> local_1d8;
  Matrix<float,_2,_2> local_1c8;
  float local_1b8;
  float local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  float local_190;
  float local_18c;
  undefined8 local_188;
  undefined4 local_180;
  undefined4 local_17c;
  undefined8 local_178;
  undefined4 local_170;
  undefined4 local_16c;
  undefined8 local_168;
  undefined4 local_160;
  undefined4 local_15c;
  Matrix<float,_2,_2> local_158;
  Matrix<float,_2,_2> local_148;
  Matrix<float,_2,_2> local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  float local_e8 [4];
  Matrix<float,_2,_2> local_d8;
  float local_c8 [4];
  undefined8 local_b8;
  undefined4 local_b0;
  undefined4 local_ac;
  Matrix<float,_2,_2> local_a8;
  Matrix<float,_2,_2> local_98;
  Matrix<float,_2,_2> local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  Matrix<float,_2,_2> local_38;
  
  pMVar8 = &local_1e8;
  puVar1 = &local_128;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        uVar10 = 0x3f800000;
        if (lVar4 != lVar7) {
          uVar10 = 0;
        }
        *(undefined4 *)((long)puVar1 + lVar7) = uVar10;
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x40);
      lVar6 = lVar6 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      lVar4 = lVar4 + 0x10;
    } while (lVar6 != 4);
    local_128 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_120 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_118 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_110 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_108 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_100 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_f8 = *(undefined8 *)evalCtx->in[3].m_data;
    uStack_f0 = *(undefined8 *)(evalCtx->in[3].m_data + 2);
  }
  else {
    local_f8 = 0;
    uStack_f0 = 0;
    local_108 = 0;
    uStack_100 = 0;
    local_118 = 0;
    uStack_110 = 0;
    local_128 = 0;
    uStack_120 = 0;
    puVar5 = &sr::(anonymous_namespace)::s_constInMat4x4;
    lVar4 = 0;
    do {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar6 * 4) = *(undefined4 *)((long)puVar5 + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0x10);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar5 = puVar5 + 4;
    } while (lVar4 != 4);
  }
  puVar1 = &local_b8;
  local_b8 = CONCAT44((undefined4)local_118,(int)local_128);
  local_b0 = local_128._4_4_;
  local_ac = local_118._4_4_;
  local_168 = CONCAT44((undefined4)local_f8,(int)local_108);
  local_160 = local_108._4_4_;
  local_15c = local_f8._4_4_;
  local_178 = CONCAT44((undefined4)uStack_110,(int)uStack_120);
  local_170 = uStack_120._4_4_;
  local_16c = uStack_110._4_4_;
  local_188 = CONCAT44((undefined4)uStack_f0,(int)uStack_100);
  local_180 = uStack_100._4_4_;
  local_17c = uStack_f0._4_4_;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  pfVar2 = (float *)&local_1c8;
  local_1c8.m_data.m_data[0].m_data[0] = 0.0;
  local_1c8.m_data.m_data[0].m_data[1] = 0.0;
  local_1c8.m_data.m_data[1].m_data[0] = 0.0;
  local_1c8.m_data.m_data[1].m_data[1] = 0.0;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      pfVar2[lVar6 * 2] = (float)*(undefined4 *)((long)puVar1 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pfVar2 = pfVar2 + 1;
    puVar1 = puVar1 + 1;
    bVar9 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar9);
  inverse<2>(&local_1c8);
  pfVar2 = (float *)&local_98;
  local_98.m_data.m_data[0].m_data[0] = 0.0;
  local_98.m_data.m_data[0].m_data[1] = 0.0;
  local_98.m_data.m_data[1].m_data[0] = 0.0;
  local_98.m_data.m_data[1].m_data[1] = 0.0;
  puVar1 = &local_168;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      pfVar2[lVar6 * 2] = (float)*(undefined4 *)((long)puVar1 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pfVar2 = pfVar2 + 1;
    puVar1 = puVar1 + 1;
    bVar9 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar9);
  pfVar2 = (float *)&local_a8;
  local_a8.m_data.m_data[0].m_data[0] = 0.0;
  local_a8.m_data.m_data[0].m_data[1] = 0.0;
  local_a8.m_data.m_data[1].m_data[0] = 0.0;
  local_a8.m_data.m_data[1].m_data[1] = 0.0;
  puVar1 = &local_178;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      pfVar2[lVar6 * 2] = (float)*(undefined4 *)((long)puVar1 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pfVar2 = pfVar2 + 1;
    puVar1 = puVar1 + 1;
    bVar9 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar9);
  pfVar2 = (float *)&local_38;
  local_38.m_data.m_data[0].m_data[0] = 0.0;
  local_38.m_data.m_data[0].m_data[1] = 0.0;
  local_38.m_data.m_data[1].m_data[0] = 0.0;
  local_38.m_data.m_data[1].m_data[1] = 0.0;
  puVar1 = &local_188;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      pfVar2[lVar6 * 2] = (float)*(undefined4 *)((long)puVar1 + lVar6 * 4);
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pfVar2 = pfVar2 + 1;
    puVar1 = puVar1 + 1;
    bVar9 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar9);
  tcu::operator*((tcu *)&local_148,&local_a8,&local_138);
  tcu::operator*((tcu *)&local_d8,&local_148,&local_98);
  pfVar2 = (float *)&local_d8;
  tcu::operator-((tcu *)&local_1c8,&local_38,(Matrix<float,_2,_2> *)pfVar2);
  inverse<2>(&local_1c8);
  local_d8.m_data.m_data[0].m_data[0] = 0.0;
  local_d8.m_data.m_data[0].m_data[1] = 0.0;
  local_d8.m_data.m_data[1].m_data[0] = 0.0;
  local_d8.m_data.m_data[1].m_data[1] = 0.0;
  pfVar3 = local_c8;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      pfVar2[lVar6 * 2] = pfVar3[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pfVar2 = pfVar2 + 1;
    pfVar3 = pfVar3 + 2;
    bVar9 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar9);
  tcu::operator*((tcu *)&local_1e8,&local_138,&local_98);
  tcu::operator*((tcu *)&local_1d8,&local_1e8,&local_88);
  tcu::operator*((tcu *)&local_158,&local_1d8,&local_a8);
  tcu::operator*((tcu *)&local_1c8,&local_158,&local_138);
  tcu::operator+((tcu *)&local_148,&local_138,&local_1c8);
  tcu::operator-((tcu *)&local_1d8,&local_d8,&local_138);
  tcu::operator*((tcu *)&local_1c8,&local_1d8,&local_98);
  tcu::operator*((tcu *)&local_158,&local_1c8,&local_88);
  pfVar2 = (float *)&local_88;
  tcu::operator-((tcu *)&local_1e8,&local_d8,(Matrix<float,_2,_2> *)pfVar2);
  tcu::operator*((tcu *)&local_1c8,&local_1e8,&local_a8);
  a = &local_1c8;
  tcu::operator*((tcu *)&local_1d8,a,&local_138);
  local_1e8.m_data.m_data[0].m_data[0] = 0.0;
  local_1e8.m_data.m_data[0].m_data[1] = 0.0;
  local_1e8.m_data.m_data[1].m_data[0] = 0.0;
  local_1e8.m_data.m_data[1].m_data[1] = 0.0;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      *(float *)((long)pMVar8 + lVar6 * 8) = pfVar2[lVar6 * 2];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pMVar8 = (Matrix<float,_2,_2> *)((long)pMVar8 + 4);
    pfVar2 = pfVar2 + 1;
    bVar9 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar9);
  local_1b8 = local_148.m_data.m_data[0].m_data[1];
  local_1b4 = local_148.m_data.m_data[1].m_data[1];
  local_1b0 = local_158.m_data.m_data[0].m_data[1];
  local_1ac = local_158.m_data.m_data[1].m_data[1];
  local_1a8 = local_1d8.m_data.m_data[0].m_data[0];
  local_1a4 = local_1d8.m_data.m_data[1].m_data[0];
  local_1a0 = local_1e8.m_data.m_data[0].m_data[0];
  local_19c = local_1e8.m_data.m_data[1].m_data[0];
  local_198 = local_1d8.m_data.m_data[0].m_data[1];
  local_194 = local_1d8.m_data.m_data[1].m_data[1];
  local_190 = local_1e8.m_data.m_data[0].m_data[1];
  local_18c = local_1e8.m_data.m_data[1].m_data[1];
  puVar1 = &local_78;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5c = 0;
  local_78 = 0;
  uStack_70 = 0;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      *(undefined4 *)((long)puVar1 + lVar6 * 4) =
           *(undefined4 *)((long)(a->m_data).m_data[0].m_data + lVar6);
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x10);
    lVar4 = lVar4 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    a = a + 1;
  } while (lVar4 != 4);
  local_168 = local_78;
  local_160 = (undefined4)uStack_70;
  local_178 = CONCAT44(uStack_60,uStack_64);
  local_170 = uStack_5c;
  local_b8 = 0;
  local_b0 = 0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_b8 + lVar4 * 4) =
         *(float *)((long)&local_168 + lVar4 * 4) + *(float *)((long)&local_178 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_188 = uStack_50;
  local_180 = (undefined4)local_58;
  local_1c8.m_data.m_data[0].m_data[0] = 0.0;
  local_1c8.m_data.m_data[0].m_data[1] = 0.0;
  local_1c8.m_data.m_data[1].m_data =
       (float  [2])((ulong)(uint)local_158.m_data.m_data[1].m_data[0] << 0x20);
  lVar4 = 0;
  do {
    local_1c8.m_data.m_data[0].m_data[lVar4] =
         *(float *)((long)&local_b8 + lVar4 * 4) + *(float *)((long)&local_188 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_c8[0] = uStack_40._4_4_;
  local_c8[1] = (float)local_48;
  local_c8[2] = (float)((ulong)local_48 >> 0x20);
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[2] = 0.0;
  lVar4 = 0;
  do {
    local_e8[lVar4] = local_1c8.m_data.m_data[0].m_data[lVar4] + local_c8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_1c8.m_data.m_data[0].m_data = (float  [2])&evalCtx->color;
  local_1c8.m_data.m_data[1].m_data[0] = 0.0;
  local_1c8.m_data.m_data[1].m_data[1] = 1.4013e-45;
  local_1b8 = 2.8026e-45;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)local_1c8.m_data.m_data[0].m_data[lVar4]] =
         *(float *)((long)&uStack_f0 + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(inverse(in0));
	}